

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_entry.cpp
# Opt level: O2

void __thiscall
duckdb::CatalogEntry::CatalogEntry
          (CatalogEntry *this,CatalogType type,Catalog *catalog,string *name_p)

{
  atomic<unsigned_long> *paVar1;
  idx_t oid;
  DatabaseManager *pDVar2;
  string sStack_38;
  
  ::std::__cxx11::string::string((string *)&sStack_38,(string *)name_p);
  pDVar2 = DatabaseInstance::GetDatabaseManager(catalog->db->db);
  LOCK();
  paVar1 = &pDVar2->next_oid;
  oid = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  CatalogEntry(this,type,&sStack_38,oid);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

CatalogEntry::CatalogEntry(CatalogType type, Catalog &catalog, string name_p)
    : CatalogEntry(type, std::move(name_p), catalog.GetDatabase().GetDatabaseManager().NextOid()) {
}